

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

void Commands::Book(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *arguments,Character *from)

{
  World *pWVar1;
  bool bVar2;
  int iVar3;
  Character *this;
  Quest *pQVar4;
  _Base_ptr p_Var5;
  PacketBuilder *this_00;
  _Rb_tree_header *p_Var6;
  size_t local_150;
  PacketBuilder reply;
  pair<const_short,_std::shared_ptr<Quest_Context>_> quest;
  string local_100;
  Character *local_e0;
  Character *local_d8;
  string home_str;
  string rank_str;
  string guild_str;
  string local_70;
  string local_50;
  
  pWVar1 = from->world;
  std::__cxx11::string::string
            ((string *)&local_50,
             (string *)
             (arguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  this = World::GetCharacter(pWVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (this == (Character *)0x0) {
    pWVar1 = from->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reply,"character_not_found",(allocator<char> *)&home_str);
    I18N::Format<>(&local_70,&pWVar1->i18n,(string *)&reply);
    (*(from->super_Command_Source)._vptr_Command_Source[5])(from,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    this_00 = &reply;
  }
  else {
    Character::HomeString_abi_cxx11_(&home_str,this);
    Character::GuildNameString_abi_cxx11_(&guild_str,this);
    Character::GuildRankString_abi_cxx11_(&rank_str,this);
    (*(this->super_Command_Source)._vptr_Command_Source[2])(&local_100,this);
    PacketBuilder::PacketBuilder
              (&reply,PACKET_BOOK,PACKET_REPLY,
               rank_str._M_string_length +
               local_100._M_string_length + home_str._M_string_length +
               (this->partner)._M_string_length + (this->title)._M_string_length +
               guild_str._M_string_length + 0xd);
    std::__cxx11::string::~string((string *)&local_100);
    (*(this->super_Command_Source)._vptr_Command_Source[2])(&local_100,this);
    PacketBuilder::AddBreakString(&reply,&local_100,0xff);
    std::__cxx11::string::~string((string *)&local_100);
    PacketBuilder::AddBreakString(&reply,&home_str,0xff);
    PacketBuilder::AddBreakString(&reply,&this->partner,0xff);
    PacketBuilder::AddBreakString(&reply,&this->title,0xff);
    PacketBuilder::AddBreakString(&reply,&guild_str,0xff);
    PacketBuilder::AddBreakString(&reply,&rank_str,0xff);
    iVar3 = Character::PlayerID(this);
    PacketBuilder::AddShort(&reply,iVar3);
    PacketBuilder::AddChar(&reply,(uint)this->clas);
    PacketBuilder::AddChar(&reply,(uint)this->gender);
    PacketBuilder::AddChar(&reply,0);
    iVar3 = (*(this->super_Command_Source)._vptr_Command_Source[1])(this);
    if ((byte)iVar3 < 4) {
      iVar3 = (*(this->super_Command_Source)._vptr_Command_Source[1])(this);
      if ((char)iVar3 == '\0') {
        iVar3 = 6;
        if (this->party == (Party *)0x0) {
          iVar3 = 0;
        }
      }
      else {
        iVar3 = (uint)(this->party != (Party *)0x0) * 5 + 4;
      }
    }
    else {
      iVar3 = (uint)(this->party != (Party *)0x0) * 5 + 5;
    }
    PacketBuilder::AddChar(&reply,iVar3);
    PacketBuilder::AddByte(&reply,0xff);
    p_Var5 = (this->quests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = &(this->quests)._M_t._M_impl.super__Rb_tree_header;
    local_150 = 0;
    local_e0 = from;
    local_d8 = this;
    for (; (_Rb_tree_header *)p_Var5 != p_Var6; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5))
    {
      std::pair<const_short,_std::shared_ptr<Quest_Context>_>::pair
                (&quest,(pair<const_short,_std::shared_ptr<Quest_Context>_> *)(p_Var5 + 1));
      if (quest.second.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        bVar2 = EOPlus::Context::Finished
                          (&(quest.second.
                             super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                            super_Context);
        if (bVar2) {
          bVar2 = Quest_Context::IsHidden
                            (quest.second.
                             super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          if (!bVar2) {
            pQVar4 = Quest_Context::GetQuest
                               (quest.second.
                                super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               );
            Quest::Name_abi_cxx11_(&local_100,pQVar4);
            local_150 = local_150 + local_100._M_string_length + 1;
            std::__cxx11::string::~string((string *)&local_100);
          }
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&quest.second.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    PacketBuilder::ReserveMore(&reply,local_150);
    for (p_Var5 = (local_d8->quests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != p_Var6; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      std::pair<const_short,_std::shared_ptr<Quest_Context>_>::pair
                (&quest,(pair<const_short,_std::shared_ptr<Quest_Context>_> *)(p_Var5 + 1));
      if (quest.second.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        bVar2 = EOPlus::Context::Finished
                          (&(quest.second.
                             super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                            super_Context);
        if (bVar2) {
          bVar2 = Quest_Context::IsHidden
                            (quest.second.
                             super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          if (!bVar2) {
            pQVar4 = Quest_Context::GetQuest
                               (quest.second.
                                super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               );
            Quest::Name_abi_cxx11_(&local_100,pQVar4);
            PacketBuilder::AddBreakString(&reply,&local_100,0xff);
            std::__cxx11::string::~string((string *)&local_100);
          }
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&quest.second.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    Character::Send(local_e0,&reply);
    PacketBuilder::~PacketBuilder(&reply);
    std::__cxx11::string::~string((string *)&rank_str);
    std::__cxx11::string::~string((string *)&guild_str);
    this_00 = (PacketBuilder *)&home_str;
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void Book(const std::vector<std::string>& arguments, Character* from)
{
	Character *victim = from->world->GetCharacter(arguments[0]);

	if (!victim)
	{
		from->ServerMsg(from->world->i18n.Format("character_not_found"));
	}
	else
	{
		std::string home_str = victim->HomeString();
		std::string guild_str = victim->GuildNameString();
		std::string rank_str = victim->GuildRankString();

		PacketBuilder reply(PACKET_BOOK, PACKET_REPLY,
			13 + victim->SourceName().length() + home_str.length() + victim->partner.length() + victim->title.length()
			+ guild_str.length() + rank_str.length());

		reply.AddBreakString(victim->SourceName());
		reply.AddBreakString(home_str);
		reply.AddBreakString(victim->partner);
		reply.AddBreakString(victim->title);
		reply.AddBreakString(guild_str);
		reply.AddBreakString(rank_str);
		reply.AddShort(victim->PlayerID());
		reply.AddChar(victim->clas);
		reply.AddChar(victim->gender);
		reply.AddChar(0);

		if (victim->SourceDutyAccess() >= ADMIN_HGM)
		{
			if (victim->party)
			{
				reply.AddChar(ICON_HGM_PARTY);
			}
			else
			{
				reply.AddChar(ICON_HGM);
			}
		}
		else if (victim->SourceDutyAccess() >= ADMIN_GUIDE)
		{
			if (victim->party)
			{
				reply.AddChar(ICON_GM_PARTY);
			}
			else
			{
				reply.AddChar(ICON_GM);
			}
		}
		else
		{
			if (victim->party)
			{
				reply.AddChar(ICON_PARTY);
			}
			else
			{
				reply.AddChar(ICON_NORMAL);
			}
		}

		reply.AddByte(255);

		std::size_t reserve = 0;

		UTIL_FOREACH(victim->quests, quest)
		{
			if (quest.second && quest.second->Finished() && !quest.second->IsHidden())
				reserve += quest.second->GetQuest()->Name().length() + 1;
		}

		reply.ReserveMore(reserve);

		UTIL_FOREACH(victim->quests, quest)
		{
			if (quest.second && quest.second->Finished() && !quest.second->IsHidden())
				reply.AddBreakString(quest.second->GetQuest()->Name());
		}

		from->Send(reply);
	}
}